

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::CopyPchCompilePdb
          (cmLocalGenerator *this,string *config,string *language,cmGeneratorTarget *target,
          string *ReuseFrom,cmGeneratorTarget *reuseTarget,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *extensions)

{
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar1;
  char *__s;
  cmCustomCommand *pcVar2;
  size_type sVar3;
  cmTarget *this_00;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  int iVar6;
  cmLocalGenerator *pcVar7;
  string *psVar8;
  string *psVar9;
  ostream *poVar10;
  cmSourceFile *this_01;
  pointer pbVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  __single_object cc;
  string to_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  string from_file;
  string pdb_prefix;
  string target_compile_pdb_dir;
  string copy_script;
  cmCustomCommandLines commandLines;
  cmGeneratedFileStream file;
  undefined1 local_500 [32];
  string local_4e0;
  string *local_4c0;
  string local_4b8;
  undefined1 local_498 [32];
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_460;
  string *local_458;
  undefined1 local_450 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_440;
  undefined8 local_410;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *local_408;
  cmCustomCommand *local_400;
  undefined8 local_3f8;
  pointer local_3f0;
  pointer local_3e8;
  undefined8 local_3e0;
  size_type local_3d8;
  pointer local_3d0;
  undefined8 local_3c8;
  string local_3c0;
  cmGeneratorTarget *local_3a0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_398;
  _Alloc_hider local_390;
  string local_388;
  string local_368;
  string local_348;
  string *local_328;
  pointer local_320;
  undefined1 local_318 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_2c8;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> local_2b0;
  undefined1 local_298 [16];
  cmState *local_288;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_280;
  char *local_278;
  undefined8 local_270;
  size_type local_268;
  pointer local_260;
  undefined8 local_258;
  undefined8 local_250;
  char *local_248;
  undefined8 local_240;
  
  local_458 = ReuseFrom;
  local_3a0 = reuseTarget;
  local_328 = language;
  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar6 == '\0') {
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"");
  }
  else {
    local_298._8_8_ = (config->_M_dataplus)._M_p;
    local_298._0_8_ = config->_M_string_length;
    local_288 = (cmState *)0x0;
    local_280 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&DAT_00000001;
    local_278 = "/";
    local_270 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_298;
    cmCatViews(&local_388,views);
  }
  pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
  cmStateSnapshot::GetDirectory
            ((cmStateDirectory *)local_298,&(pcVar7->super_cmOutputConverter).StateSnapshot);
  psVar8 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_298);
  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_298._8_8_ = (psVar8->_M_dataplus)._M_p;
  local_298._0_8_ = psVar8->_M_string_length;
  local_288 = (cmState *)0x0;
  local_280 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)&DAT_00000001;
  local_278 = "/";
  local_270 = 0;
  local_260 = (psVar9->_M_dataplus)._M_p;
  local_268 = psVar9->_M_string_length;
  local_258 = 0;
  local_250 = 5;
  local_248 = ".dir/";
  local_240 = 0;
  views_00._M_len = 4;
  views_00._M_array = (iterator)local_298;
  cmCatViews(&local_368,views_00);
  __s = (config->_M_dataplus)._M_p;
  local_298._0_8_ = local_368._M_string_length;
  local_298._8_8_ = local_368._M_dataplus._M_p;
  local_288 = (cmState *)0x0;
  local_280 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0xd;
  local_278 = "copy_idb_pdb_";
  local_270 = 0;
  local_4c0 = config;
  local_268 = strlen(__s);
  local_258 = 0;
  local_250 = 6;
  local_248 = ".cmake";
  local_240 = 0;
  views_01._M_len = 4;
  views_01._M_array = (iterator)local_298;
  local_260 = __s;
  cmCatViews((string *)local_318,views_01);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,(string *)local_318,false,None);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# CMake generated file\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# The compiler generated pdb file needs to be written to disk\n",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# by mspdbsrv. The foreach retry loop is needed to make sure\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# the pdb file is ready to be copied.\n\n",0x27);
  pbVar11 = (extensions->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_320 = (extensions->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 != local_320) {
    do {
      pcVar7 = cmGeneratorTarget::GetLocalGenerator(local_3a0);
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_450,&(pcVar7->super_cmOutputConverter).StateSnapshot);
      psVar8 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_450);
      local_450._8_8_ = (psVar8->_M_dataplus)._M_p;
      local_450._0_8_ = psVar8->_M_string_length;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x89d511;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_458->_M_dataplus)._M_p;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_458->_M_string_length;
      local_410 = 0;
      local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x12;
      local_400 = (cmCustomCommand *)0x7e2b91;
      local_3f8 = 0;
      local_3e0 = 0;
      local_3d0 = (pbVar11->_M_dataplus)._M_p;
      local_3d8 = pbVar11->_M_string_length;
      local_3c8 = 0;
      views_02._M_len = 6;
      views_02._M_array = (iterator)local_450;
      local_3f0 = local_440.UpPositions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_3e8 = local_440.UpPositions.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      cmCatViews((string *)local_498,views_02);
      pcVar7 = cmGeneratorTarget::GetLocalGenerator(target);
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)local_450,&(pcVar7->super_cmOutputConverter).StateSnapshot);
      psVar8 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_450);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_(target);
      local_450._8_8_ = (psVar8->_M_dataplus)._M_p;
      local_450._0_8_ = psVar8->_M_string_length;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_00000001;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x89d511;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(psVar9->_M_dataplus)._M_p;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)psVar9->_M_string_length;
      local_410 = 0;
      local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x12;
      local_400 = (cmCustomCommand *)0x7e2b91;
      local_3f8 = 0;
      views_03._M_len = 4;
      views_03._M_array = (iterator)local_450;
      cmCatViews(&local_4e0,views_03);
      local_450._0_8_ = local_4e0._M_string_length;
      local_450._8_8_ = local_4e0._M_dataplus._M_p;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_458->_M_dataplus)._M_p;
      local_440.Data.
      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_458->_M_string_length;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar11->_M_dataplus)._M_p;
      local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)pbVar11->_M_string_length;
      local_410 = 0;
      views_04._M_len = 3;
      views_04._M_array = (iterator)local_450;
      cmCatViews(&local_4b8,views_04);
      local_500._0_8_ = local_500 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_500,local_4b8._M_dataplus._M_p,
                 local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
      local_450._0_8_ = &local_440;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"PREFIX","");
      psVar8 = cmGeneratorTarget::GetSafeProperty(target,(string *)local_450);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_450._0_8_ !=
          &local_440) {
        operator_delete((void *)local_450._0_8_,
                        (ulong)((long)local_440.Data.
                                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
      if (psVar8->_M_string_length != 0) {
        local_450._0_8_ = local_4e0._M_string_length;
        local_450._8_8_ = local_4e0._M_dataplus._M_p;
        local_440.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_440.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(psVar8->_M_dataplus)._M_p;
        local_440.Data.
        super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)psVar8->_M_string_length;
        local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_458->_M_dataplus)._M_p;
        local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_458->_M_string_length;
        local_410 = 0;
        local_400 = (cmCustomCommand *)(pbVar11->_M_dataplus)._M_p;
        local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                    pbVar11->_M_string_length;
        local_3f8 = 0;
        views_05._M_len = 4;
        views_05._M_array = (iterator)local_450;
        cmCatViews(&local_3c0,views_05);
        std::__cxx11::string::operator=((string *)local_500,(string *)&local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
          operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"foreach(retry RANGE 1 30)\n",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"  if (EXISTS \"",0xe)
      ;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" AND (NOT EXISTS \"",0x13);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_500._0_8_,local_500._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" OR NOT \"",10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_500._0_8_,local_500._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  \" IS_NEWER_THAN \"",0x13);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"))\n",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"    execute_process(COMMAND ${CMAKE_COMMAND} -E copy",0x34);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298," \"",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\"",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," \"",2);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,local_4e0._M_dataplus._M_p,local_4e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" RESULT_VARIABLE result ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ERROR_QUIET)\n",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"    if (NOT result EQUAL 0)\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"      execute_process(COMMAND ${CMAKE_COMMAND}",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298," -E sleep 1)\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"    else()\n",0xb);
      if (psVar8->_M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"  file(REMOVE \"",0xf);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,(char *)local_500._0_8_,local_500._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"  file(RENAME \"",0xf);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_298,local_4b8._M_dataplus._M_p,
                             local_4b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" \"",3);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,(char *)local_500._0_8_,local_500._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"      break()\n",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"    endif()\n",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"  elseif(NOT EXISTS \"",0x15);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_298,(char *)local_498._0_8_,local_498._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\")\n",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,"    execute_process(COMMAND ${CMAKE_COMMAND}",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," -E sleep 1)\n",0xd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  endif()\n",10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"endforeach()\n",0xd);
      if ((cmCustomCommand *)local_500._0_8_ != (cmCustomCommand *)(local_500 + 0x10)) {
        operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_498._0_8_ != local_498 + 0x10) {
        operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
      }
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != local_320);
  }
  psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  pcVar2 = (cmCustomCommand *)(psVar8->_M_dataplus)._M_p;
  sVar3 = psVar8->_M_string_length;
  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar6 == '\0') {
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4e0,pcVar2,
               (char *)((long)&(pcVar2->Outputs).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sVar3));
  }
  else {
    local_450._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_450._8_8_ = "$<$<CONFIG:";
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_4c0->_M_dataplus)._M_p;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4c0->_M_string_length;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x7e2951;
    local_410 = 0;
    local_3f8 = 0;
    local_3f0 = (pointer)0x1;
    local_3e8 = (pointer)0x7e6647;
    local_3e0 = 0;
    views_06._M_len = 5;
    views_06._M_array = (iterator)local_450;
    local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)sVar3;
    local_400 = pcVar2;
    cmCatViews(&local_4e0,views_06);
  }
  local_498._0_8_ = local_4e0._M_string_length;
  local_498._8_8_ = local_4e0._M_dataplus._M_p;
  local_450._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xd;
  local_450._8_8_ = "-DPDB_PREFIX=";
  local_440.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_440.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388._M_string_length;
  local_440.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388._M_dataplus._M_p;
  local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  views_07._M_len = 2;
  views_07._M_array = (iterator)local_450;
  cmCatViews((string *)local_500,views_07);
  uVar4 = local_500._0_8_;
  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar6 == '\0') {
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,uVar4,(char *)(uVar4 + local_500._8_8_));
  }
  else {
    local_450._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_450._8_8_ = "$<$<CONFIG:";
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_4c0->_M_dataplus)._M_p;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4c0->_M_string_length;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x7e2951;
    local_410 = 0;
    local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_500._8_8_;
    local_400 = (cmCustomCommand *)uVar4;
    local_3f8 = 0;
    local_3f0 = (pointer)0x1;
    local_3e8 = (pointer)0x7e6647;
    local_3e0 = 0;
    views_08._M_len = 5;
    views_08._M_array = (iterator)local_450;
    cmCatViews(&local_4b8,views_08);
  }
  local_498._16_8_ = local_4b8._M_string_length;
  local_498._24_8_ = local_4b8._M_dataplus._M_p;
  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar6 == '\0') {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"-P","");
  }
  else {
    local_450._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_450._8_8_ = "$<$<CONFIG:";
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_4c0->_M_dataplus)._M_p;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4c0->_M_string_length;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x7e2951;
    local_410 = 0;
    local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x2;
    local_400 = (cmCustomCommand *)0x7dcb57;
    local_3f8 = 0;
    local_3f0 = (pointer)0x1;
    local_3e8 = (pointer)0x7e6647;
    local_3e0 = 0;
    views_09._M_len = 5;
    views_09._M_array = (iterator)local_450;
    cmCatViews(&local_3c0,views_09);
  }
  uVar4 = local_318._0_8_;
  local_478 = local_3c0._M_string_length;
  local_470 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c0._M_dataplus._M_p;
  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar6 == '\0') {
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,uVar4,(char *)(uVar4 + local_318._8_8_));
  }
  else {
    local_450._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_450._8_8_ = "$<$<CONFIG:";
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_4c0->_M_dataplus)._M_p;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4c0->_M_string_length;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x7e2951;
    local_410 = 0;
    local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_318._8_8_;
    local_400 = (cmCustomCommand *)uVar4;
    local_3f8 = 0;
    local_3f0 = (pointer)0x1;
    local_3e8 = (pointer)0x7e6647;
    local_3e0 = 0;
    views_10._M_len = 5;
    views_10._M_array = (iterator)local_450;
    cmCatViews(&local_348,views_10);
  }
  local_468 = local_348._M_string_length;
  local_460 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_348._M_dataplus._M_p;
  ilist._M_len = 4;
  ilist._M_array = (iterator)local_498;
  cmMakeSingleCommandLine((cmCustomCommandLines *)&local_2b0,ilist);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if ((cmCustomCommand *)local_500._0_8_ != (cmCustomCommand *)(local_500 + 0x10)) {
    operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_4b8.field_2._M_allocated_capacity = 0;
  local_4b8._M_dataplus._M_p = (pointer)0x0;
  local_4b8._M_string_length = 0;
  local_450._0_8_ = local_368._M_string_length;
  local_450._8_8_ = local_368._M_dataplus._M_p;
  local_440.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_440.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_388._M_string_length;
  local_440.Data.
  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_388._M_dataplus._M_p;
  local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(local_458->_M_dataplus)._M_p;
  local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_458->_M_string_length;
  local_410 = 0;
  local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x4;
  local_400 = (cmCustomCommand *)0x7e2a25;
  local_3f8 = 0;
  views_11._M_len = 4;
  views_11._M_array = (iterator)local_450;
  cmCatViews(&local_4e0,views_11);
  _Var5._M_p = local_4e0._M_dataplus._M_p;
  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x28])();
  if ((char)iVar6 == '\0') {
    local_498._0_8_ = local_498 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,_Var5._M_p,
               (long)&(((vector<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                         *)local_4e0._M_string_length)->
                      super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                      )._M_impl.super__Vector_impl_data._M_start + _Var5._M_p);
  }
  else {
    local_450._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xb;
    local_450._8_8_ = "$<$<CONFIG:";
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(local_4c0->_M_dataplus)._M_p;
    local_440.Data.
    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_4c0->_M_string_length;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x2;
    local_440.UpPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x7e2951;
    local_410 = 0;
    local_408 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                local_4e0._M_string_length;
    local_400 = (cmCustomCommand *)_Var5._M_p;
    local_3f8 = 0;
    local_3f0 = (pointer)0x1;
    local_3e8 = (pointer)0x7e6647;
    local_3e0 = 0;
    views_12._M_len = 5;
    views_12._M_array = (iterator)local_450;
    cmCatViews((string *)local_498,views_12);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498);
  pcVar1 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_498 + 0x10);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_498._0_8_ != pcVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  std::make_unique<cmCustomCommand>();
  uVar4 = local_500._0_8_;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::vector
            (&local_2c8,&local_2b0);
  cmCustomCommand::SetCommandLines((cmCustomCommand *)uVar4,(cmCustomCommandLines *)&local_2c8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_2c8);
  cmCustomCommand::SetComment((cmCustomCommand *)local_500._0_8_,"");
  uVar4 = local_500._0_8_;
  *(bool *)(local_500._0_8_ + 0x12e) = true;
  local_498._8_8_ = (char *)0x0;
  local_498._16_8_ = local_498._16_8_ & 0xffffffffffffff00;
  local_498._0_8_ = pcVar1;
  cmGeneratorTarget::GetPchFile
            ((string *)local_450,local_3a0,local_4c0,local_328,(string *)local_498);
  __l._M_len = 1;
  __l._M_array = (iterator)local_450;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_4e0,__l,(allocator_type *)&local_3c0);
  cmCustomCommand::AppendDepends
            ((cmCustomCommand *)uVar4,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4e0);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_450._0_8_ != &local_440) {
    operator_delete((void *)local_450._0_8_,
                    (ulong)((long)local_440.Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_498._0_8_ != pcVar1) {
    operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
  }
  iVar6 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x2a])();
  uVar4 = local_500._0_8_;
  if ((char)iVar6 == '\0') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4b8);
    cmCustomCommand::SetOutputs((cmCustomCommand *)uVar4,&local_2f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2f8);
    local_398._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>.
    _M_t.super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         local_500._0_8_;
    local_500._0_8_ = (pointer)0x0;
    this_01 = AddCustomCommandToOutput(this,&local_398,false);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_398)
    ;
    local_450._0_8_ = &local_440;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_450,"CXX_SCAN_FOR_MODULES","");
    local_498._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"0","");
    cmSourceFile::SetProperty(this_01,(string *)local_450,(string *)local_498);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_498._0_8_ != pcVar1) {
      operator_delete((void *)local_498._0_8_,local_498._16_8_ + 1);
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_450._0_8_ != &local_440)
    {
      operator_delete((void *)local_450._0_8_,
                      (ulong)((long)local_440.Data.
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 1));
    }
    psVar8 = cmSourceFile::ResolveFullPath(this_01,(string *)0x0,(string *)0x0);
    cmGeneratorTarget::AddSource(target,psVar8,false);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_4b8);
    cmCustomCommand::SetByproducts((cmCustomCommand *)uVar4,&local_2e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2e0);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    local_390._M_p = (pointer)local_500._0_8_;
    local_500._0_8_ = (pointer)0x0;
    AddCustomCommandToTarget
              (this,psVar8,PRE_BUILD,
               (unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_390,
               Accept);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
              ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)&local_390);
  }
  this_00 = target->Target;
  local_450._0_8_ = &local_440;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_450,"COMPILE_PDB_OUTPUT_DIRECTORY","");
  cmTarget::SetProperty(this_00,(string *)local_450,&local_368);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_450._0_8_ != &local_440) {
    operator_delete((void *)local_450._0_8_,
                    (ulong)((long)local_440.Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
            ((unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *)local_500);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_4b8);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector(&local_2b0);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if ((cmCustomCommand *)local_318._0_8_ != (cmCustomCommand *)(local_318 + 0x10)) {
    operator_delete((void *)local_318._0_8_,local_318._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::CopyPchCompilePdb(
  const std::string& config, const std::string& language,
  cmGeneratorTarget* target, const std::string& ReuseFrom,
  cmGeneratorTarget* reuseTarget, const std::vector<std::string>& extensions)
{
  const std::string pdb_prefix =
    this->GetGlobalGenerator()->IsMultiConfig() ? cmStrCat(config, "/") : "";

  const std::string target_compile_pdb_dir =
    cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
             target->GetName(), ".dir/");

  const std::string copy_script = cmStrCat(
    target_compile_pdb_dir, "copy_idb_pdb_", config.c_str(), ".cmake");
  cmGeneratedFileStream file(copy_script);

  file << "# CMake generated file\n";

  file << "# The compiler generated pdb file needs to be written to disk\n"
       << "# by mspdbsrv. The foreach retry loop is needed to make sure\n"
       << "# the pdb file is ready to be copied.\n\n";

  for (auto const& extension : extensions) {
    const std::string from_file =
      cmStrCat(reuseTarget->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/", ReuseFrom, ".dir/${PDB_PREFIX}", ReuseFrom, extension);

    const std::string to_dir =
      cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), "/",
               target->GetName(), ".dir/${PDB_PREFIX}");

    const std::string to_file = cmStrCat(to_dir, ReuseFrom, extension);

    std::string dest_file = to_file;

    std::string const& prefix = target->GetSafeProperty("PREFIX");
    if (!prefix.empty()) {
      dest_file = cmStrCat(to_dir, prefix, ReuseFrom, extension);
    }

    file << "foreach(retry RANGE 1 30)\n";
    file << "  if (EXISTS \"" << from_file << "\" AND (NOT EXISTS \""
         << dest_file << "\" OR NOT \"" << dest_file << "  \" IS_NEWER_THAN \""
         << from_file << "\"))\n";
    file << "    execute_process(COMMAND ${CMAKE_COMMAND} -E copy";
    file << " \"" << from_file << "\""
         << " \"" << to_dir << "\" RESULT_VARIABLE result "
         << " ERROR_QUIET)\n";
    file << "    if (NOT result EQUAL 0)\n"
         << "      execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "    else()\n";
    if (!prefix.empty()) {
      file << "  file(REMOVE \"" << dest_file << "\")\n";
      file << "  file(RENAME \"" << to_file << "\" \"" << dest_file << "\")\n";
    }
    file << "      break()\n"
         << "    endif()\n";
    file << "  elseif(NOT EXISTS \"" << from_file << "\")\n"
         << "    execute_process(COMMAND ${CMAKE_COMMAND}"
         << " -E sleep 1)\n"
         << "  endif()\n";
    file << "endforeach()\n";
  }

  auto configGenex = [&](cm::string_view expr) -> std::string {
    if (this->GetGlobalGenerator()->IsMultiConfig()) {
      return cmStrCat("$<$<CONFIG:", config, ">:", expr, ">");
    }
    return std::string(expr);
  };

  cmCustomCommandLines commandLines = cmMakeSingleCommandLine(
    { configGenex(cmSystemTools::GetCMakeCommand()),
      configGenex(cmStrCat("-DPDB_PREFIX=", pdb_prefix)), configGenex("-P"),
      configGenex(copy_script) });

  const char* no_message = "";

  std::vector<std::string> outputs;
  outputs.push_back(configGenex(
    cmStrCat(target_compile_pdb_dir, pdb_prefix, ReuseFrom, ".pdb")));

  auto cc = cm::make_unique<cmCustomCommand>();
  cc->SetCommandLines(commandLines);
  cc->SetComment(no_message);
  cc->SetStdPipesUTF8(true);
  cc->AppendDepends({ reuseTarget->GetPchFile(config, language) });

  if (this->GetGlobalGenerator()->IsVisualStudio()) {
    cc->SetByproducts(outputs);
    this->AddCustomCommandToTarget(
      target->GetName(), cmCustomCommandType::PRE_BUILD, std::move(cc),
      cmObjectLibraryCommands::Accept);
  } else {
    cc->SetOutputs(outputs);
    cmSourceFile* copy_rule = this->AddCustomCommandToOutput(std::move(cc));
    copy_rule->SetProperty("CXX_SCAN_FOR_MODULES", "0");

    if (copy_rule) {
      target->AddSource(copy_rule->ResolveFullPath());
    }
  }

  target->Target->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              target_compile_pdb_dir);
}